

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pasteboard.c
# Opt level: O1

void wpe_pasteboard_string_initialize
               (wpe_pasteboard_string *string,char *in_string,uint64_t in_length)

{
  char *__dest;
  
  if (string->data != (char *)0x0) {
    return;
  }
  __dest = (char *)calloc(in_length,1);
  if (__dest != (char *)0x0) {
    string->data = __dest;
    string->length = in_length;
    memcpy(__dest,in_string,in_length);
    return;
  }
  wpe_alloc_fail("/workspace/llm4binary/github/license_c_cmakelists/WebPlatformForEmbedded[P]libwpe/src/pasteboard.c"
                 ,0x29,in_length);
}

Assistant:

void
wpe_pasteboard_string_initialize(struct wpe_pasteboard_string* string, const char* in_string, uint64_t in_length)
{
    if (string->data)
        return;

    string->data = wpe_calloc(in_length, sizeof(char));
    string->length = in_length;
    memcpy(string->data, in_string, in_length);
}